

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_volumemeter.c
# Opt level: O1

uint32_t FAudioCreateVolumeMeter(FAPO **ppApo,uint32_t Flags)

{
  FAPOBase *fapo;
  uint8_t *pParameterBlocks;
  undefined4 in_register_00000034;
  
  fapo = (FAPOBase *)SDL_malloc(0xe8,CONCAT44(in_register_00000034,Flags));
  pParameterBlocks = (uint8_t *)SDL_malloc(0x3c);
  SDL_memset(pParameterBlocks,0,0x3c);
  SDL_memcpy(&VolumeMeterProperties,&FAudioFX_CLSID_AudioVolumeMeter,0x10);
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,&VolumeMeterProperties,pParameterBlocks,0x14,'\x01',SDL_malloc,SDL_free,
             SDL_realloc);
  (fapo->base).LockForProcess = FAudioFXVolumeMeter_LockForProcess;
  (fapo->base).UnlockForProcess = FAudioFXVolumeMeter_UnlockForProcess;
  (fapo->base).Process = FAudioFXVolumeMeter_Process;
  (fapo->base).GetParameters = FAudioFXVolumeMeter_GetParameters;
  fapo->Destructor = FAudioFXVolumeMeter_Free;
  *ppApo = (FAPO *)fapo;
  return 0;
}

Assistant:

uint32_t FAudioCreateVolumeMeter(FAPO** ppApo, uint32_t Flags)
{
	return FAudioCreateVolumeMeterWithCustomAllocatorEXT(
		ppApo,
		Flags,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}